

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Float width)

{
  undefined1 auVar1 [16];
  Point2i st_00;
  Point2i st_01;
  Point2f st_02;
  Point2f st_03;
  Point2f st_04;
  Point2f st_05;
  int iVar2;
  int *piVar3;
  Tuple2<pbrt::Point2,_float> *in_RSI;
  long in_RDI;
  float fVar4;
  Float FVar5;
  float fVar6;
  double dVar7;
  undefined1 extraout_var [12];
  undefined1 auVar16 [12];
  undefined1 auVar8 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar9 [16];
  undefined1 auVar18 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined8 uVar17;
  undefined1 auVar15 [64];
  RGB RVar19;
  int vb;
  Float va;
  Float delta;
  Point2i sti;
  Point2i resolution;
  int iLevel;
  Float level;
  int nLevels;
  undefined8 in_stack_fffffffffffffe58;
  Point2<int> *in_stack_fffffffffffffe60;
  MIPMap *in_stack_fffffffffffffe68;
  char (*in_stack_fffffffffffffea0) [44];
  Tuple2<pbrt::Point2,_int> *this_00;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  uint uVar20;
  int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  LogLevel level_00;
  LogLevel in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffedc;
  MIPMap *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Tuple2<pbrt::Point2,_int> local_64;
  int local_5c [9];
  float local_38;
  float local_34;
  int local_30;
  float local_2c;
  Tuple2<pbrt::Point2,_float> *local_28;
  undefined8 local_14;
  Float local_c;
  undefined1 auVar10 [64];
  
  local_28 = in_RSI;
  local_30 = Levels((MIPMap *)0x5bfa33);
  fVar4 = (float)(local_30 + -1);
  local_38 = 1e-08;
  std::max<float>(&local_2c,&local_38);
  FVar5 = Log2(0.0);
  fVar6 = fVar4 + FVar5;
  local_34 = fVar6;
  iVar2 = Levels((MIPMap *)0x5bfaad);
  auVar18 = (undefined1  [56])0x0;
  if (fVar6 < (float)(iVar2 + -1)) {
    local_5c[1] = 0;
    dVar7 = std::floor((double)(ulong)(uint)local_34);
    local_5c[0] = (int)SUB84(dVar7,0);
    piVar3 = std::max<int>(local_5c + 1,local_5c);
    local_5c[2] = *piVar3;
    if (*(int *)(in_RDI + 0x2c) == 0) {
      local_64 = (Tuple2<pbrt::Point2,_int>)
                 LevelResolution(in_stack_fffffffffffffe68,
                                 (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      fVar6 = Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
      this_00 = &local_64;
      auVar16 = extraout_var;
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[](this_00,0);
      auVar8._0_4_ = (float)*piVar3;
      auVar8._4_12_ = auVar16;
      uVar20 = 0xbf000000;
      auVar1 = vfmadd213ss_fma(auVar8,ZEXT416((uint)fVar6),SUB6416(ZEXT464(0xbf000000),0));
      std::round(auVar1._0_8_);
      iVar2 = 1;
      fVar6 = Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
      auVar16 = extraout_var_00;
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[](this_00,iVar2);
      auVar9._0_4_ = (float)*piVar3;
      auVar9._4_12_ = auVar16;
      auVar1 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar6),ZEXT416(uVar20));
      std::round(auVar1._0_8_);
      auVar18 = extraout_var_01;
      Point2<int>::Point2(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                          (int)in_stack_fffffffffffffe58);
      st_01.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffef0;
      st_01.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffffeec;
      RVar19 = Texel<pbrt::RGB>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,st_01);
      local_c = RVar19.b;
      auVar11._0_8_ = RVar19._0_8_;
      auVar11._8_56_ = auVar18;
      local_14 = vmovlpd_avx(auVar11._0_16_);
    }
    else if (*(int *)(in_RDI + 0x2c) == 1) {
      auVar18 = ZEXT856(0);
      st_02.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffef0;
      st_02.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffeec;
      RVar19 = Bilerp<pbrt::RGB>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,st_02);
      local_c = RVar19.b;
      auVar12._0_8_ = RVar19._0_8_;
      auVar12._8_56_ = auVar18;
      local_14 = vmovlpd_avx(auVar12._0_16_);
    }
    else {
      level_00 = (LogLevel)((ulong)in_RDI >> 0x20);
      if (*(int *)(in_RDI + 0x2c) != 2) {
        LogFatal<char_const(&)[44]>
                  (level_00,(char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb4,
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea0);
      }
      if (local_5c[2] == 0) {
        auVar18 = ZEXT856(0);
        st_03.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffef0;
        st_03.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffeec;
        RVar19 = Bilerp<pbrt::RGB>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,st_03);
        local_c = RVar19.b;
        auVar13._0_8_ = RVar19._0_8_;
        auVar13._8_56_ = auVar18;
        local_14 = vmovlpd_avx(auVar13._0_16_);
      }
      else {
        if (1.0 < local_34 - (float)local_5c[2]) {
          LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],float&,char_const(&)[2],int&>
                    (in_stack_fffffffffffffed4,(char *)CONCAT44(fVar6,fVar4),level_00,
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char (*) [6])CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (char (*) [2])CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (char (*) [6])in_stack_fffffffffffffee0,
                     (float *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (char (*) [2])CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        }
        auVar18 = ZEXT856(0);
        st_04.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffef0;
        st_04.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffeec;
        RVar19 = Bilerp<pbrt::RGB>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,st_04);
        FVar5 = (Float)((ulong)in_RDI >> 0x20);
        auVar14._0_8_ = RVar19._0_8_;
        auVar14._8_56_ = auVar18;
        vmovlpd_avx(auVar14._0_16_);
        uVar17 = 0;
        st_05.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffef0;
        st_05.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffeec;
        RVar19 = Bilerp<pbrt::RGB>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,st_05);
        auVar18 = (undefined1  [56])0x0;
        auVar1._8_8_ = uVar17;
        auVar1._0_8_ = RVar19._0_8_;
        vmovlpd_avx(auVar1);
        RVar19 = Lerp(FVar5,(RGB *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      (RGB *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        local_c = RVar19.b;
        auVar15._0_8_ = RVar19._0_8_;
        auVar15._8_56_ = auVar18;
        local_14 = vmovlpd_avx(auVar15._0_16_);
      }
    }
  }
  else {
    Levels((MIPMap *)0x5bfaca);
    Point2<int>::Point2(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58);
    st_00.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffef0;
    st_00.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffffeec;
    RVar19 = Texel<pbrt::RGB>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,st_00);
    local_c = RVar19.b;
    auVar10._0_8_ = RVar19._0_8_;
    auVar10._8_56_ = auVar18;
    local_14 = vmovlpd_avx(auVar10._0_16_);
  }
  RVar19.b = local_c;
  RVar19.r = (Float)(undefined4)local_14;
  RVar19.g = (Float)local_14._4_4_;
  return RVar19;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Float width) const {
    // Compute MIPMap level
    int nLevels = Levels();
    Float level = nLevels - 1 + Log2(std::max<Float>(width, 1e-8));

    if (level >= Levels() - 1)
        return Texel<T>(Levels() - 1, {0, 0});

    int iLevel = std::max(0, int(std::floor(level)));
    if (options.filter == FilterFunction::Point) {
        Point2i resolution = LevelResolution(iLevel);
        Point2i sti(std::round(st[0] * resolution[0] - 0.5f),
                    std::round(st[1] * resolution[1] - 0.5f));
        return Texel<T>(iLevel, sti);
    } else if (options.filter == FilterFunction::Bilinear) {
        return Bilerp<T>(iLevel, st);
    } else {
        CHECK(options.filter == FilterFunction::Trilinear);

        if (iLevel == 0)
            return Bilerp<T>(0, st);
        else {
            Float delta = level - iLevel;
            CHECK_LE(delta, 1);
            return Lerp(delta, Bilerp<T>(iLevel, st), Bilerp<T>(iLevel + 1, st));
        }
    }
}